

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall clask::logger::~logger(logger *this)

{
  logger *this_local;
  
  ~logger(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

inline logger::~logger() {
  if (lv >= logger::level()) {
    os << std::endl;
    std::cerr << os.str().c_str();
  }
}